

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O0

void __thiscall merlin::ijgp::ijgp(ijgp *this,graphical_model *gm)

{
  string local_48 [48];
  graphical_model *local_18;
  graphical_model *gm_local;
  ijgp *this_local;
  
  local_18 = gm;
  gm_local = &this->super_graphical_model;
  graphical_model::graphical_model(&this->super_graphical_model,gm);
  algorithm::algorithm(&this->super_algorithm);
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__ijgp_00297c98;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&DAT_00297d30;
  graphical_model::graphical_model(&this->m_gmo,local_18);
  Task::Task(&this->m_task,PR);
  ElimOp::ElimOp(&this->m_elim_op,Max);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_order);
  graphical_model::OrderMethod::OrderMethod(&this->m_order_method,MinFill);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_parents);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&this->m_beliefs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_best_config);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&this->m_clusters);
  std::
  vector<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>,_std::allocator<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>_>_>
  ::vector(&this->m_separators);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&this->m_originals);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::vector(&this->m_scopes);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&this->m_in);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&this->m_out);
  my_set<unsigned_long>::my_set(&this->m_roots,10);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&this->m_forward);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&this->m_backward);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&this->m_schedule);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->m_edge_indeces);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map(&this->m_cluster2var);
  graphical_model::clear_factors(&this->super_graphical_model);
  std::__cxx11::string::string(local_48);
  (*(this->super_graphical_model)._vptr_graphical_model[0xf])(this,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

ijgp(const graphical_model& gm) : graphical_model(gm), m_gmo(gm) {
		clear_factors();
		set_properties();
	}